

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugLoc::dump
          (DWARFDebugLoc *this,raw_ostream *OS,MCRegisterInfo *MRI,DIDumpOptions DumpOpts,
          Optional<unsigned_long> Offset)

{
  unsigned_long *puVar1;
  LocationList *pLVar2;
  const_reference pLVar3;
  LocationLists *__range1;
  long lVar4;
  LocationList *L;
  MCRegisterInfo *MRI_local;
  Optional<unsigned_long> Offset_local;
  anon_class_32_4_b58d201b DumpLocationList;
  
  MRI_local = (MCRegisterInfo *)Offset.Storage.field_0;
  Offset_local.Storage.field_0.empty = Offset.Storage.hasVal;
  Offset_local.Storage._8_8_ = OS;
  if (((undefined1  [16])Offset.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pLVar2 = (LocationList *)
             (this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
             super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
             super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
             super_SmallVectorBase.BeginX;
    for (lVar4 = (ulong)(this->Locations).super_SmallVectorImpl<llvm::DWARFDebugLoc::LocationList>.
                        super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>.
                        super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>.
                        super_SmallVectorBase.Size * 0x68; lVar4 != 0; lVar4 = lVar4 + -0x68) {
      dump::anon_class_32_4_b58d201b::operator()
                ((anon_class_32_4_b58d201b *)&Offset_local.Storage.hasVal,pLVar2);
      pLVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>::back
                         ((SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void> *)this
                         );
      if (pLVar2 != pLVar3) {
        raw_ostream::operator<<(OS,'\n');
      }
      pLVar2 = pLVar2 + 1;
    }
  }
  else {
    puVar1 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                       ((OptionalStorage<unsigned_long,_true> *)&MRI_local);
    pLVar2 = getLocationListAtOffset(this,*puVar1);
    if (pLVar2 != (LocationList *)0x0) {
      dump::anon_class_32_4_b58d201b::operator()
                ((anon_class_32_4_b58d201b *)&Offset_local.Storage.hasVal,pLVar2);
    }
  }
  return;
}

Assistant:

void DWARFDebugLoc::dump(raw_ostream &OS, const MCRegisterInfo *MRI, DIDumpOptions DumpOpts,
                         Optional<uint64_t> Offset) const {
  auto DumpLocationList = [&](const LocationList &L) {
    OS << format("0x%8.8" PRIx64 ": ", L.Offset);
    L.dump(OS, 0, IsLittleEndian, AddressSize, MRI, nullptr, DumpOpts, 12);
    OS << "\n";
  };

  if (Offset) {
    if (auto *L = getLocationListAtOffset(*Offset))
      DumpLocationList(*L);
    return;
  }

  for (const LocationList &L : Locations) {
    DumpLocationList(L);
    if (&L != &Locations.back())
      OS << '\n';
  }
}